

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O0

int mbedtls_aes_xts_setkey_enc(mbedtls_aes_xts_context *ctx,uchar *key,uint keybits)

{
  uint local_40;
  uint local_3c;
  uint key2bits;
  uint key1bits;
  uchar *key2;
  uchar *key1;
  int ret;
  uint keybits_local;
  uchar *key_local;
  mbedtls_aes_xts_context *ctx_local;
  
  key1._0_4_ = 0xffffff92;
  key1._4_4_ = keybits;
  _ret = key;
  key_local = (uchar *)ctx;
  key1._0_4_ = mbedtls_aes_xts_decode_keys
                         (key,keybits,&key2,&local_3c,(uchar **)&key2bits,&local_40);
  ctx_local._4_4_ = (int)key1;
  if (((int)key1 == 0) &&
     (key1._0_4_ = mbedtls_aes_setkey_enc
                             ((mbedtls_aes_context *)(key_local + 0x120),_key2bits,local_40),
     ctx_local._4_4_ = (int)key1, (int)key1 == 0)) {
    ctx_local._4_4_ = mbedtls_aes_setkey_enc((mbedtls_aes_context *)key_local,key2,local_3c);
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_aes_xts_setkey_enc( mbedtls_aes_xts_context *ctx,
                                const unsigned char *key,
                                unsigned int keybits)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    const unsigned char *key1, *key2;
    unsigned int key1bits, key2bits;

    AES_VALIDATE_RET( ctx != NULL );
    AES_VALIDATE_RET( key != NULL );

    ret = mbedtls_aes_xts_decode_keys( key, keybits, &key1, &key1bits,
                                       &key2, &key2bits );
    if( ret != 0 )
        return( ret );

    /* Set the tweak key. Always set tweak key for the encryption mode. */
    ret = mbedtls_aes_setkey_enc( &ctx->tweak, key2, key2bits );
    if( ret != 0 )
        return( ret );

    /* Set crypt key for encryption. */
    return mbedtls_aes_setkey_enc( &ctx->crypt, key1, key1bits );
}